

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

DdNode * Cudd_addComputeCube(DdManager *dd,DdNode **vars,int *phase,int n)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *h;
  DdNode *g;
  ulong uVar3;
  DdNode *n_00;
  ulong uVar4;
  
  pDVar2 = dd->one;
  uVar3 = (ulong)pDVar2 & 0xfffffffffffffffe;
  *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
  if (0 < n) {
    pDVar1 = dd->zero;
    uVar4 = (ulong)(uint)n + 1;
    n_00 = pDVar2;
    do {
      if ((phase == (int *)0x0) || (phase[uVar4 - 2] != 0)) {
        pDVar2 = vars[uVar4 - 2];
        h = pDVar1;
        g = n_00;
      }
      else {
        pDVar2 = vars[uVar4 - 2];
        h = n_00;
        g = pDVar1;
      }
      pDVar2 = Cudd_addIte(dd,pDVar2,g,h);
      if (pDVar2 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n_00);
        return (DdNode *)0x0;
      }
      uVar3 = (ulong)pDVar2 & 0xfffffffffffffffe;
      *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
      Cudd_RecursiveDeref(dd,n_00);
      uVar4 = uVar4 - 1;
      n_00 = pDVar2;
    } while (1 < uVar4);
  }
  *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + -1;
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addComputeCube(
  DdManager * dd,
  DdNode ** vars,
  int * phase,
  int  n)
{
    DdNode      *cube, *zero;
    DdNode      *fn;
    int         i;

    cube = DD_ONE(dd);
    cuddRef(cube);
    zero = DD_ZERO(dd);

    for (i = n - 1; i >= 0; i--) {
        if (phase == NULL || phase[i] != 0) {
            fn = Cudd_addIte(dd,vars[i],cube,zero);
        } else {
            fn = Cudd_addIte(dd,vars[i],zero,cube);
        }
        if (fn == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(fn);
        Cudd_RecursiveDeref(dd,cube);
        cube = fn;
    }
    cuddDeref(cube);

    return(cube);

}